

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<kj::String&,char_const(&)[9],kj::String,kj::String>
          (String *__return_storage_ptr__,kj *this,String *params,char (*params_1) [9],
          String *params_2,String *params_3)

{
  String *pSVar1;
  char (*value) [9];
  ArrayPtr<const_char> local_70;
  ArrayPtr<const_char> local_60;
  ArrayPtr<const_char> local_50;
  ArrayPtr<const_char> local_40;
  String *local_30;
  String *params_local_3;
  String *params_local_2;
  char (*params_local_1) [9];
  String *params_local;
  
  local_30 = params_2;
  params_local_3 = (String *)params_1;
  params_local_2 = params;
  params_local_1 = (char (*) [9])this;
  params_local = __return_storage_ptr__;
  pSVar1 = fwd<kj::String&>((String *)this);
  local_40 = toCharSequence<kj::String&>(pSVar1);
  value = ::const((char (*) [9])params_local_2);
  local_50 = toCharSequence<char_const(&)[9]>(value);
  pSVar1 = fwd<kj::String>(params_local_3);
  local_60 = toCharSequence<kj::String>(pSVar1);
  pSVar1 = fwd<kj::String>(local_30);
  local_70 = toCharSequence<kj::String>(pSVar1);
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_40,&local_50,&local_60,&local_70,
             (ArrayPtr<const_char> *)params_3);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}